

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O0

value * lightconf::value_type_info<std::vector<int,_std::allocator<int>_>_>::create_value
                  (value *__return_storage_ptr__,vector<int,_std::allocator<int>_> *x)

{
  pointer this;
  bool bVar1;
  value local_e8;
  reference local_50;
  int *u;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  value_vector_type inner_vals;
  vector<int,_std::allocator<int>_> *x_local;
  
  inner_vals.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)x;
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::vector
            ((vector<lightconf::value,_std::allocator<lightconf::value>_> *)&__range2);
  this = inner_vals.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __end0 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)
                      inner_vals.
                      super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  u = (int *)std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&u);
    if (!bVar1) break;
    local_50 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
    value_type_info<int>::create_value(&local_e8,local_50);
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::push_back
              ((vector<lightconf::value,_std::allocator<lightconf::value>_> *)&__range2,&local_e8);
    value::~value(&local_e8);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  value::value(__return_storage_ptr__,(value_vector_type *)&__range2);
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
            ((vector<lightconf::value,_std::allocator<lightconf::value>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

static value create_value(const std::vector<U>& x) {
        value_vector_type inner_vals;
        for (const auto& u : x) {
            inner_vals.push_back(value_type_info<U>::create_value(u));
        }
        return value(inner_vals);
    }